

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitUnary(OptimizeInstructions *this,Unary *curr)

{
  Type *this_00;
  Id IVar1;
  Expression *pEVar2;
  pointer puVar3;
  Literal *pLVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Global *pGVar6;
  uintptr_t uVar7;
  bool bVar8;
  UnaryOp UVar9;
  BinaryOp BVar10;
  BinaryOp BVar11;
  Index IVar12;
  uint uVar13;
  UnaryOp UVar14;
  Unary *curr_00;
  Const *right;
  Binary *rep;
  Expression *pEVar15;
  ulong uVar16;
  char cVar17;
  Literal *pLVar18;
  undefined7 uVar19;
  Literal *unaff_R13;
  Expression *unaff_R15;
  Literal local_e0;
  Literal local_c8;
  undefined1 local_b0 [8];
  Builder builder;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_a0;
  undefined1 local_70 [8];
  Const *c;
  Literal local_58;
  BinaryOp local_3c;
  pointer local_38;
  Const *c_1;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 1) {
    return;
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId) {
    UVar14 = curr->op;
    unaff_R15 = (Expression *)(ulong)UVar14;
    UVar9 = Match::Internal::AbstractUnaryOpK::getOp((Type)(curr->value->type).id,EqZ);
    if (((UVar14 == UVar9) && (unaff_R15 = curr->value, unaff_R15->_id == BinaryId)) &&
       (BVar11 = *(BinaryOp *)(unaff_R15 + 1),
       BVar10 = Abstract::getBinary((Type)*(uintptr_t *)(unaff_R15[1].type.id + 8),Sub),
       BVar11 == BVar10)) {
      uVar16 = *(ulong *)(unaff_R15[1].type.id + 8);
      if (uVar16 < 7) {
        *(undefined4 *)(unaff_R15 + 1) = *(undefined4 *)(&DAT_00e163e4 + uVar16 * 4);
        (unaff_R15->type).id = 2;
        replaceCurrent(this,unaff_R15);
        return;
      }
      goto LAB_009de7f6;
    }
  }
  pEVar15 = (Expression *)0x0;
  local_a0.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_b0 = (undefined1  [8])local_70;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId) {
    UVar14 = curr->op;
    UVar9 = Match::Internal::AbstractUnaryOpK::getOp((Type)(curr->value->type).id,EqZ);
    if (UVar14 == UVar9) {
      pEVar2 = curr->value;
      pEVar15 = (Expression *)0x0;
      unaff_R15 = pEVar15;
      if (pEVar2->_id == BinaryId) {
        BVar11 = *(BinaryOp *)(pEVar2 + 1);
        BVar10 = Abstract::getBinary((Type)*(uintptr_t *)(pEVar2[1].type.id + 8),Add);
        unaff_R15 = pEVar2;
        if (BVar11 == BVar10) {
          puVar3 = *(pointer *)(pEVar2 + 2);
          pEVar15 = (Expression *)0x0;
          if (*(char *)&(puVar3->_M_t).
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> ==
              '\x0e') {
            if (local_b0 != (undefined1  [8])0x0) {
              (((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 *)local_b0)->
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = puVar3;
            }
            unaff_R13 = &local_58;
            Literal::Literal(unaff_R13,(Literal *)(puVar3 + 2));
            bVar8 = Match::Internal::
                    Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                    ::matches(&local_a0,unaff_R13);
            pEVar15 = (Expression *)(ulong)bVar8;
            Literal::~Literal(&local_58);
          }
        }
        else {
          pEVar15 = (Expression *)0x0;
        }
      }
    }
    else {
      pEVar15 = (Expression *)0x0;
      unaff_R15 = (Expression *)(ulong)UVar14;
    }
  }
  if ((char)pEVar15 != '\0') {
    unaff_R13 = (Literal *)local_b0;
    Literal::neg(unaff_R13,
                 (((Literals *)((long)local_70 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                 _M_elems);
    Literal::operator=((((Literals *)((long)local_70 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       fixed._M_elems,unaff_R13);
    Literal::~Literal((Literal *)local_b0);
    uVar16 = (((Literals *)((long)local_70 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
    if (6 < uVar16) goto LAB_009de7f6;
    *(undefined4 *)(unaff_R15 + 1) = *(undefined4 *)(&DAT_00e163e4 + uVar16 * 4);
    (unaff_R15->type).id = 2;
    replaceCurrent(this,unaff_R15);
    if ((char)pEVar15 != '\0') {
      return;
    }
  }
  pLVar18 = (Literal *)0x0;
  local_a0.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_b0 = (undefined1  [8])&stack0xffffffffffffffc8;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId) {
    UVar14 = curr->op;
    UVar9 = Match::Internal::AbstractUnaryOpK::getOp((Type)(curr->value->type).id,EqZ);
    if (UVar14 != UVar9) {
      pLVar18 = (Literal *)0x0;
      goto LAB_009de207;
    }
    pLVar4 = (Literal *)curr->value;
    pLVar18 = (Literal *)0x0;
    unaff_R13 = pLVar18;
    if ((pLVar4->field_0).v128[0] != '\x10') goto LAB_009de207;
    uVar7 = (pLVar4->type).id;
    BVar11 = Abstract::getBinary((Type)((pLVar4[1].field_0.gcData.
                                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->values).super_SmallVector<wasm::Literal,_1UL>.
                                       usedFixed,RemS);
    unaff_R13 = pLVar4;
    if ((BinaryOp)uVar7 != BVar11) {
LAB_009de502:
      pLVar18 = (Literal *)0x0;
      goto LAB_009de207;
    }
    p_Var5 = pLVar4[1].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pLVar18 = (Literal *)0x0;
    if (*(char *)&p_Var5->_vptr__Sp_counted_base != '\x0e') goto LAB_009de207;
    if (local_b0 != (undefined1  [8])0x0) {
      (((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         *)local_b0)->
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var5;
    }
    Literal::Literal(&local_58,(Literal *)(p_Var5 + 1));
    bVar8 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&local_a0,&local_58);
    Literal::~Literal(&local_58);
    if (!bVar8) goto LAB_009de502;
    bVar8 = Literal::isSignedMin((Literal *)(local_38 + 2));
    uVar19 = (undefined7)((ulong)&local_58 >> 8);
    if (bVar8) {
      pEVar15 = (Expression *)CONCAT71(uVar19,1);
      cVar17 = '\0';
    }
    else {
      Literal::abs(&local_58,(int)local_38 + 0x10);
      uVar16 = Literal::getInteger(&local_58);
      pLVar18 = (Literal *)0x1;
      cVar17 = '\x01';
      if (uVar16 == 0) goto LAB_009de207;
      pEVar15 = (Expression *)CONCAT71(uVar19,(uVar16 & uVar16 - 1) == 0);
    }
  }
  else {
LAB_009de207:
    cVar17 = (char)pLVar18;
    pEVar15 = (Expression *)0x0;
  }
  if (cVar17 != '\0') {
    Literal::~Literal(&local_58);
  }
  puVar3 = local_38;
  if ((char)pEVar15 != '\0') {
    pGVar6 = ((_Head_base<0UL,_wasm::Global_*,_false> *)
             &local_38[1]._M_t.
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl;
    if ((Global *)0x6 < pGVar6) goto LAB_009de7f6;
    *(undefined4 *)&(unaff_R13->type).id = *(undefined4 *)(&DAT_00e16374 + (long)pGVar6 * 4);
    bVar8 = Literal::isSignedMin((Literal *)(puVar3 + 2));
    if (bVar8) {
      Literal::makeSignedMax
                ((Literal *)local_b0,
                 (Type)((_Head_base<0UL,_wasm::Global_*,_false> *)
                       &local_38[1]._M_t.
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl);
      Literal::operator=((Literal *)(local_38 + 2),(Literal *)local_b0);
      pLVar18 = (Literal *)local_b0;
    }
    else {
      Literal::abs((Literal *)local_70,(int)local_38 + 0x10);
      Literal::makeOne(&local_c8,
                       (Type)((_Head_base<0UL,_wasm::Global_*,_false> *)
                             &local_38[1]._M_t.
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl);
      Literal::sub((Literal *)local_b0,(Literal *)local_70,&local_c8);
      Literal::operator=((Literal *)(local_38 + 2),(Literal *)local_b0);
      Literal::~Literal((Literal *)local_b0);
      Literal::~Literal(&local_c8);
      pLVar18 = (Literal *)local_70;
    }
    Literal::~Literal(pLVar18);
    replaceCurrent(this,(Expression *)curr);
    if ((char)pEVar15 != '\0') {
      return;
    }
  }
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
      && (curr->op == WrapInt64)) &&
     (curr_00 = (Unary *)optimizeWrappedResult(this,curr), curr_00 != (Unary *)0x0))
  goto LAB_009de7a8;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
      && (curr->op == EqZInt32)) &&
     ((curr_00 = (Unary *)curr->value,
      (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId
      && ((curr_00->op == WrapInt64 &&
          (IVar12 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr_00->value,this), IVar12 < 0x21
          )))))) {
    curr_00->op = EqZInt64;
    goto LAB_009de7a8;
  }
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).shrinkLevel == 0) {
    bVar8 = false;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
    {
      if ((curr->op == EqZInt32) && (pEVar2 = curr->value, pEVar2->_id == UnaryId)) {
        UVar14 = *(UnaryOp *)(pEVar2 + 1);
        pEVar15 = (Expression *)(ulong)UVar14;
        UVar9 = Match::Internal::AbstractUnaryOpK::getOp
                          ((Type)*(uintptr_t *)(pEVar2[1].type.id + 8),EqZ);
        if (UVar14 == UVar9) {
          pEVar15 = (Expression *)pEVar2[1].type.id;
          bVar8 = true;
          goto LAB_009de3c1;
        }
      }
      bVar8 = false;
    }
LAB_009de3c1:
    if (bVar8) {
      local_b0 = (undefined1  [8])
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule;
      local_3c = Abstract::getBinary((Type)(pEVar15->type).id,Ne);
      Literal::makeZero(&local_e0,(Type)(pEVar15->type).id);
      right = Builder::makeConst((Builder *)local_b0,&local_e0);
      rep = Builder::makeBinary((Builder *)local_b0,local_3c,pEVar15,(Expression *)right);
      replaceCurrent(this,(Expression *)rep);
      Literal::~Literal(&local_e0);
      if (bVar8) {
        return;
      }
    }
  }
  if (((((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
       && (pEVar15 = curr->value, pEVar15->_id == UnaryId)) && (*(int *)(pEVar15 + 1) == 0x18)) &&
     (UVar14 = curr->op, (UVar14 & ~ClzInt64) == ExtendSInt32)) {
    curr_00 = (Unary *)pEVar15[1].type.id;
    IVar12 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)curr_00,this);
    if (((UVar14 == ExtendSInt32) && (IVar12 < 0x20)) ||
       ((UVar14 == ExtendUInt32 && (IVar12 < 0x21)))) goto LAB_009de7a8;
  }
  if (((((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
          .currModule)->features).features & 0x20) != 0) &&
      ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId))
     && ((curr->op == ExtendSInt32 &&
         ((curr_00 = (Unary *)curr->value,
          (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id ==
          UnaryId && (curr_00->op == WrapInt64)))))) {
    curr_00->op = ExtendS32Int64;
    goto LAB_009de6cd;
  }
  UVar14 = curr->op;
  if (((UVar14 & ~ClzInt64) == ExtendSInt32) &&
     (curr_00 = (Unary *)curr->value,
     (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == LoadId))
  {
    if (UVar14 == ExtendSInt32) {
      bVar8 = (char)curr_00->op == PopcntInt32;
    }
    else {
      bVar8 = false;
    }
    if (((UVar14 != ExtendUInt32) || (CtzInt32 < (byte)(char)curr_00->op)) ||
       (*(byte *)((long)&curr_00->op + 1) == 0)) {
      if (bVar8) {
        if ((char)curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression.
                  type.id != '\0') goto LAB_009de52e;
        if (bVar8) {
          *(byte *)((long)&curr_00->op + 1) = 1;
        }
      }
LAB_009de6cd:
      (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 3;
      goto LAB_009de7a8;
    }
  }
LAB_009de52e:
  IVar12 = getSignExtBits(this,curr->value);
  if (IVar12 != 0) {
    UVar14 = curr->op;
    if (8 < IVar12 || UVar14 != ExtendS8Int32) {
      if (((8 < IVar12 || UVar14 != ExtendS8Int64) &&
          (0x10 < IVar12 || (UVar14 & ~CtzInt32) != ExtendS16Int32)) &&
         (0x20 < IVar12 || UVar14 != ExtendS32Int64)) goto LAB_009de597;
    }
    curr_00 = (Unary *)curr->value;
    goto LAB_009de7a8;
  }
LAB_009de597:
  if (((ulong)curr->op < 0x2f) && ((0x600600000000U >> ((ulong)curr->op & 0x3f) & 1) != 0)) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type;
    curr_00 = (Unary *)curr->value;
    IVar1 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
    if (IVar1 == LoadId) {
      if (((char)curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression.type
                 .id == '\0') &&
         (UVar14 = curr_00->op, uVar13 = wasm::Type::getByteSize(this_00),
         uVar13 == (byte)(char)UVar14)) {
        (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
             this_00->id;
        goto LAB_009de7a8;
      }
    }
    else if ((((IVar1 == UnaryId) && ((ulong)curr_00->op < 0x2f)) &&
             ((0x600600000000U >> ((ulong)curr_00->op & 0x3f) & 1) != 0)) &&
            (curr_00 = (Unary *)curr_00->value,
            (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id
            == this_00->id)) goto LAB_009de7a8;
  }
  if (curr->op - AbsFloat32 < 2) {
    curr_00 = (Unary *)curr->value;
    IVar1 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
    if (IVar1 == BinaryId) {
      UVar14 = curr_00->op;
      UVar9 = Abstract::getBinary((Type)(curr_00->super_SpecificExpression<(wasm::Expression::Id)15>
                                        ).super_Expression.type.id,Mul);
      if (((UVar14 == UVar9) ||
          (UVar14 = curr_00->op,
          UVar9 = Abstract::getBinary((Type)(curr_00->
                                            super_SpecificExpression<(wasm::Expression::Id)15>).
                                            super_Expression.type.id,DivS), UVar14 == UVar9)) &&
         (bVar8 = areConsecutiveInputsEqual
                            (this,curr_00->value,
                             *(Expression **)
                              &curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.
                               super_Expression), bVar8)) goto LAB_009de7a8;
      if ((((this->fastMath == true) &&
           (UVar14 = curr_00->op,
           UVar9 = Abstract::getBinary((Type)(curr_00->
                                             super_SpecificExpression<(wasm::Expression::Id)15>).
                                             super_Expression.type.id,Sub), UVar14 == UVar9)) &&
          (curr_00->value->_id == ConstId)) &&
         (bVar8 = Literal::isZero((Literal *)(curr_00->value + 1)), bVar8)) {
        pEVar15 = *(Expression **)
                   &curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression;
LAB_009de6b6:
        curr->value = pEVar15;
        curr_00 = curr;
        goto LAB_009de7a8;
      }
    }
    else if (IVar1 == UnaryId) {
      uVar16 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.
               id;
      if (6 < uVar16) {
LAB_009de7f6:
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
      if (curr_00->op == *(UnaryOp *)(&DAT_00e16108 + uVar16 * 4)) {
        pEVar15 = curr_00->value;
        goto LAB_009de6b6;
      }
    }
  }
  else if (curr->op == EqZInt32) {
    curr_00 = (Unary *)curr->value;
    if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id ==
         BinaryId) &&
       (UVar14 = invertBinaryOp(this,curr_00->op),
       UVar14 != (TruncSatZeroSVecF64x2ToVecI32x4|FloorVecF16x8))) {
      curr_00->op = UVar14;
      goto LAB_009de7a8;
    }
    pEVar15 = Properties::getSignExtValue(curr->value);
    if (pEVar15 != (Expression *)0x0) {
      IVar12 = Properties::getSignExtBits(curr->value);
      pEVar15 = makeZeroExt(this,pEVar15,IVar12);
      goto LAB_009de6b6;
    }
  }
  curr_00 = (Unary *)deduplicateUnary(this,curr);
  if (((curr_00 == (Unary *)0x0) &&
      (curr_00 = (Unary *)simplifyRoundingsAndConversions(this,curr), curr_00 == (Unary *)0x0)) &&
     (curr_00 = (Unary *)replaceZeroBitsWithZero(this,(Expression *)curr), curr_00 == (Unary *)0x0))
  {
    return;
  }
LAB_009de7a8:
  replaceCurrent(this,(Expression *)curr_00);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    {
      using namespace Match;
      using namespace Abstract;
      Builder builder(*getModule());
      {
        // eqz(x - y)  =>  x == y
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Sub, any(), any())))) {
          inner->op = Abstract::getBinary(inner->left->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz(x + C)  =>  x == -C
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Add, any(), ival(&c))))) {
          c->value = c->value.neg();
          inner->op = Abstract::getBinary(c->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz((signed)x % C_pot)  =>  eqz(x & (abs(C_pot) - 1))
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, RemS, any(), ival(&c)))) &&
            (c->value.isSignedMin() ||
             Bits::isPowerOf2(c->value.abs().getInteger()))) {
          inner->op = Abstract::getBinary(c->type, And);
          if (c->value.isSignedMin()) {
            c->value = Literal::makeSignedMax(c->type);
          } else {
            c->value = c->value.abs().sub(Literal::makeOne(c->type));
          }
          return replaceCurrent(curr);
        }
      }
      {
        // i32.wrap_i64 can be removed if the operations inside it do not
        // actually require 64 bits, e.g.:
        //
        // i32.wrap_i64(i64.extend_i32_u(x))  =>  x
        if (matches(curr, unary(WrapInt64, any()))) {
          if (auto* ret = optimizeWrappedResult(curr)) {
            return replaceCurrent(ret);
          }
        }
      }
      {
        // i32.eqz(i32.wrap_i64(x))  =>  i64.eqz(x)
        //   where maxBits(x) <= 32
        Unary* inner;
        Expression* x;
        if (matches(curr, unary(EqZInt32, unary(&inner, WrapInt64, any(&x)))) &&
            Bits::getMaxBits(x, this) <= 32) {
          inner->op = EqZInt64;
          return replaceCurrent(inner);
        }
      }
      {
        // i32.eqz(i32.eqz(x))  =>  i32(x) != 0
        // i32.eqz(i64.eqz(x))  =>  i64(x) != 0
        //   iff shinkLevel == 0
        // (1 instruction instead of 2, but 1 more byte)
        if (getPassRunner()->options.shrinkLevel == 0) {
          Expression* x;
          if (matches(curr, unary(EqZInt32, unary(EqZ, any(&x))))) {
            Builder builder(*getModule());
            return replaceCurrent(builder.makeBinary(
              getBinary(x->type, Ne),
              x,
              builder.makeConst(Literal::makeZero(x->type))));
          }
        }
      }
      {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 31
        //
        // i64.extend_i32_u(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 32
        Expression* x;
        UnaryOp unaryOp;
        if (matches(curr, unary(&unaryOp, unary(WrapInt64, any(&x))))) {
          if (unaryOp == ExtendSInt32 || unaryOp == ExtendUInt32) {
            auto maxBits = Bits::getMaxBits(x, this);
            if ((unaryOp == ExtendSInt32 && maxBits <= 31) ||
                (unaryOp == ExtendUInt32 && maxBits <= 32)) {
              return replaceCurrent(x);
            }
          }
        }
      }
      if (getModule()->features.hasSignExt()) {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  i64.extend32_s(x)
        Unary* inner;
        if (matches(curr,
                    unary(ExtendSInt32, unary(&inner, WrapInt64, any())))) {
          inner->op = ExtendS32Int64;
          inner->type = Type::i64;
          return replaceCurrent(inner);
        }
      }
    }

    if (curr->op == ExtendUInt32 || curr->op == ExtendSInt32) {
      if (auto* load = curr->value->dynCast<Load>()) {
        // i64.extend_i32_s(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // i64.extend_i32_u(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // but we can't do this in following cases:
        //
        //    i64.extend_i32_u(i32.load8_s(x))
        //    i64.extend_i32_u(i32.load16_s(x))
        //
        // this mixed sign/zero extensions can't represent in single
        // signed or unsigned 64-bit load operation. For example if `load8_s(x)`
        // return i8(-1) (0xFF) than sign extended result will be
        // i32(-1) (0xFFFFFFFF) and with zero extension to i64 we got
        // finally 0x00000000FFFFFFFF. However with `i64.load8_s` in this
        // situation we got `i64(-1)` (all ones) and with `i64.load8_u` it
        // will be 0x00000000000000FF.
        //
        // Another limitation is atomics which only have unsigned loads.
        // So we also avoid this only case:
        //
        //   i64.extend_i32_s(i32.atomic.load(x))

        // Special case for i32.load. In this case signedness depends on
        // extend operation.
        bool willBeSigned = curr->op == ExtendSInt32 && load->bytes == 4;
        if (!(curr->op == ExtendUInt32 && load->bytes <= 2 && load->signed_) &&
            !(willBeSigned && load->isAtomic)) {
          if (willBeSigned) {
            load->signed_ = true;
          }
          load->type = Type::i64;
          return replaceCurrent(load);
        }
      }
    }

    // Simple sign extends can be removed if the value is already sign-extended.
    auto signExtBits = getSignExtBits(curr->value);
    if (signExtBits > 0) {
      // Note that we can handle the case of |curr| having a larger sign-extend:
      // if we have an 8-bit value in 32-bit, then there are 24 sign bits, and
      // doing a sign-extend to 16 will only affect 16 of those 24, and the
      // effect is to leave them as they are.
      if ((curr->op == ExtendS8Int32 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int32 && signExtBits <= 16) ||
          (curr->op == ExtendS8Int64 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int64 && signExtBits <= 16) ||
          (curr->op == ExtendS32Int64 && signExtBits <= 32)) {
        return replaceCurrent(curr->value);
      }
    }

    if (Abstract::hasAnyReinterpret(curr->op)) {
      // i32.reinterpret_f32(f32.reinterpret_i32(x))  =>  x
      // i64.reinterpret_f64(f64.reinterpret_i64(x))  =>  x
      // f32.reinterpret_i32(i32.reinterpret_f32(x))  =>  x
      // f64.reinterpret_i64(i64.reinterpret_f64(x))  =>  x
      if (auto* inner = curr->value->dynCast<Unary>()) {
        if (Abstract::hasAnyReinterpret(inner->op)) {
          if (inner->value->type == curr->type) {
            return replaceCurrent(inner->value);
          }
        }
      }
      // f32.reinterpret_i32(i32.load(x))  =>  f32.load(x)
      // f64.reinterpret_i64(i64.load(x))  =>  f64.load(x)
      // i32.reinterpret_f32(f32.load(x))  =>  i32.load(x)
      // i64.reinterpret_f64(f64.load(x))  =>  i64.load(x)
      if (auto* load = curr->value->dynCast<Load>()) {
        if (!load->isAtomic && load->bytes == curr->type.getByteSize()) {
          load->type = curr->type;
          return replaceCurrent(load);
        }
      }
    }

    if (curr->op == EqZInt32) {
      if (auto* inner = curr->value->dynCast<Binary>()) {
        // Try to invert a relational operation using De Morgan's law
        auto op = invertBinaryOp(inner->op);
        if (op != InvalidBinary) {
          inner->op = op;
          return replaceCurrent(inner);
        }
      }
      // eqz of a sign extension can be of zero-extension
      if (auto* ext = Properties::getSignExtValue(curr->value)) {
        // we are comparing a sign extend to a constant, which means we can
        // use a cheaper zext
        auto bits = Properties::getSignExtBits(curr->value);
        curr->value = makeZeroExt(ext, bits);
        return replaceCurrent(curr);
      }
    } else if (curr->op == AbsFloat32 || curr->op == AbsFloat64) {
      // abs(-x)   ==>   abs(x)
      if (auto* unaryInner = curr->value->dynCast<Unary>()) {
        if (unaryInner->op ==
            Abstract::getUnary(unaryInner->type, Abstract::Neg)) {
          curr->value = unaryInner->value;
          return replaceCurrent(curr);
        }
      }
      // abs(x * x)   ==>   x * x
      // abs(x / x)   ==>   x / x
      if (auto* binary = curr->value->dynCast<Binary>()) {
        if ((binary->op == Abstract::getBinary(binary->type, Abstract::Mul) ||
             binary->op == Abstract::getBinary(binary->type, Abstract::DivS)) &&
            areConsecutiveInputsEqual(binary->left, binary->right)) {
          return replaceCurrent(binary);
        }
        // abs(0 - x)   ==>   abs(x),
        // only for fast math
        if (fastMath &&
            binary->op == Abstract::getBinary(binary->type, Abstract::Sub)) {
          if (auto* c = binary->left->dynCast<Const>()) {
            if (c->value.isZero()) {
              curr->value = binary->right;
              return replaceCurrent(curr);
            }
          }
        }
      }
    }

    if (auto* ret = deduplicateUnary(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = simplifyRoundingsAndConversions(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = replaceZeroBitsWithZero(curr)) {
      return replaceCurrent(ret);
    }
  }